

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O3

void __thiscall OpenSketch<4U>::Init(OpenSketch<4U> *this,Data<4U> *from,Data<4U> *to)

{
  HashMap<4U> *this_00;
  byte *pbVar1;
  int iVar2;
  uchar *puVar3;
  KV<4U> *pKVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  uint position;
  int iVar13;
  uint uVar14;
  mapped_type i;
  int *piVar15;
  bool bVar16;
  KV<4U> *kv;
  uint8_t *data;
  Stream<4U> stream;
  undefined4 local_2c;
  
  local_2c = *(undefined4 *)to->str;
  uVar10 = 0;
  uVar8 = Hash::BOBHash32((uchar *)&local_2c,4,0);
  uVar5 = (ulong)uVar8 % (ulong)*(uint *)&(this->super_Abstract<4U>).field_0x6c;
  uVar6 = uVar5 >> 3;
  uVar14 = 1 << ((byte)uVar5 & 7);
  piVar15 = this->counter;
  iVar13 = 0x7fffffff;
  bVar7 = true;
  do {
    bVar16 = bVar7;
    uVar9 = ((uint)(*(int *)from->str * -0x3361d2af) >> 0x11 | *(int *)from->str * 0x16a88000) *
            0x1b873593;
    uVar10 = (uVar9 >> 0x13 | (uVar9 ^ uVar10) << 0xd) * 5 + 0xe6546b64;
    uVar10 = (uVar10 >> 0x10 ^ uVar10 ^ 4) * -0x7a143595;
    uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
    uVar5 = (ulong)(uVar10 >> 0x10 ^ uVar10) % (ulong)(uint)this->COLUMN;
    puVar3 = this->bitset[uVar5].bitset;
    if ((uVar14 & puVar3[uVar6]) == 0) {
      piVar15[uVar5] = piVar15[uVar5] + 1;
      pbVar1 = puVar3 + uVar6;
      *pbVar1 = *pbVar1 | (byte)uVar14;
      piVar15 = this->counter;
    }
    if (piVar15[uVar5] <= iVar13) {
      iVar13 = piVar15[uVar5];
    }
    uVar10 = 1;
    bVar7 = false;
  } while (bVar16);
  this_00 = &this->mp;
  iVar11 = std::
           _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this_00->_M_h,from);
  if (iVar11.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    pKVar4 = this->heap;
    if (this->heap_num < this->CAPACITY) {
      *(undefined4 *)pKVar4[this->heap_num].second.str = *(undefined4 *)from->str;
      iVar2 = this->heap_num;
      this->heap[iVar2].first = iVar13;
      this->heap_num = iVar2 + 1;
      pmVar12 = std::__detail::
                _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,from);
      *pmVar12 = iVar2;
      heap_up(this,this->heap_num + -1);
      return;
    }
    if (iVar13 <= pKVar4->first) {
      return;
    }
    std::
    _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&this_00->_M_h,&pKVar4->second);
    *(undefined4 *)(pKVar4->second).str = *(undefined4 *)from->str;
    pKVar4->first = iVar13;
    pmVar12 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    *pmVar12 = 0;
    i = 0;
  }
  else {
    pKVar4 = this->heap;
    pmVar12 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    if (pKVar4[*pmVar12].first == iVar13) {
      return;
    }
    pKVar4 = this->heap;
    pmVar12 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    pKVar4[*pmVar12].first = iVar13;
    pmVar12 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    i = *pmVar12;
  }
  heap_down(this,i);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		Stream<DATA_LEN> stream(from, to);

		int min_num = INT_MAX;
		uint index = Hash::BOBHash32(stream.str + DATA_LEN, DATA_LEN) % LENGTH;
		for (int i = 0; i < 2; ++i) {
			uint pos = from.Hash(i) % COLUMN;
			if (!bitset[pos].Get(index)) {
				counter[pos] += 1;
				bitset[pos].Set(index);
			}
			min_num = MIN(min_num, counter[pos]);
		}

		if (mp.find(from) != mp.end()) {
			if (heap[mp[from]].first != min_num) {
				heap[mp[from]].first = min_num;
				heap_down(mp[from]);
			}
		}
		else if (heap_num < CAPACITY) {
			heap[heap_num].second = from;
			heap[heap_num].first = min_num;
			mp[from] = heap_num++;
			heap_up(heap_num - 1);
		}
		else if (min_num > heap[0].first) {
			KV<DATA_LEN>& kv = heap[0];
			mp.erase(kv.second);
			kv.second = from;
			kv.first = min_num;
			mp[from] = 0;
			heap_down(0);
		}
	}